

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::blur_gaussian<float>(image *this,ConstPtr *in,float sigma)

{
  bool bVar1;
  int width;
  int height;
  int channels;
  int iVar2;
  invalid_argument *this_00;
  ImageBase *pIVar3;
  reference pvVar4;
  int *piVar5;
  element_type *this_01;
  float *pfVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  float fVar9;
  double dVar10;
  Ptr PVar11;
  int local_d8 [3];
  int local_cc;
  int local_c8;
  int idx_1;
  int i_2;
  Accum<float> accum_1;
  int cc_1;
  int x_1;
  int y_1;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int idx;
  int i_1;
  Accum<float> accum;
  int cc;
  int x;
  int y;
  int px;
  Ptr sep;
  int local_60;
  allocator<float> local_59;
  int i;
  vector<float,_std::allocator<float>_> kernel;
  int ks;
  int c;
  int h;
  int w;
  float local_1c;
  ConstPtr *pCStack_18;
  float sigma_local;
  ConstPtr *in_local;
  Ptr *out;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  local_1c = sigma;
  pCStack_18 = in;
  in_local = (ConstPtr *)this;
  bVar1 = std::operator==(in,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((local_1c < -0.1) || (0.1 < local_1c)) {
    pIVar3 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in);
    width = ImageBase::width(pIVar3);
    pIVar3 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in);
    height = ImageBase::height(pIVar3);
    pIVar3 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in);
    channels = ImageBase::channels(pIVar3);
    dVar10 = std::ceil((double)(ulong)(uint)(local_1c * 2.884));
    kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (int)SUB84(dVar10,0);
    iVar2 = kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ + 1;
    std::allocator<float>::allocator(&local_59);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i,(long)iVar2,&local_59);
    std::allocator<float>::~allocator(&local_59);
    for (local_60 = 0;
        local_60 <
        kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ + 1; local_60 = local_60 + 1) {
      sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = (float)local_60;
      fVar9 = math::gaussian<float>
                        ((float *)((long)&sep.
                                          super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 4),&local_1c);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&i,(long)local_60);
      *pvVar4 = fVar9;
    }
    Image<float>::create((Image<float> *)&y,width,height,channels);
    x = 0;
    for (cc = 0; cc < height; cc = cc + 1) {
      for (accum.w = 0.0; (int)accum.w < width; accum.w = (float)((int)accum.w + 1)) {
        for (accum.v = 0.0; (int)accum.v < channels; accum.v = (float)((int)accum.v + 1)) {
          idx = 0;
          math::Accum<float>::Accum((Accum<float> *)&i_1,(float *)&idx);
          for (local_98 = -kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
              local_98 <=
              kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; local_98 = local_98 + 1) {
            local_a0 = (int)accum.w + local_98;
            local_a4 = 0;
            y_1 = width + -1;
            piVar5 = math::clamp<int>(&local_a0,&local_a4,&y_1);
            local_9c = *piVar5;
            this_01 = std::
                      __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)in);
            pfVar6 = Image<float>::at(this_01,cc * width + local_9c,(int)accum.v);
            iVar2 = local_98;
            if (local_98 < 1) {
              iVar2 = -local_98;
            }
            pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)&i,(long)iVar2);
            math::Accum<float>::add((Accum<float> *)&i_1,pfVar6,*pvVar4);
          }
          fVar9 = math::Accum<float>::normalized((Accum<float> *)&i_1);
          peVar7 = std::
                   __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&y);
          pfVar6 = Image<float>::at(peVar7,x,(int)accum.v);
          *pfVar6 = fVar9;
        }
        x = x + 1;
      }
    }
    Image<float>::create((Image<float> *)this,width,height,channels);
    x = 0;
    for (cc_1 = 0; cc_1 < height; cc_1 = cc_1 + 1) {
      for (accum_1.w = 0.0; (int)accum_1.w < width; accum_1.w = (float)((int)accum_1.w + 1)) {
        for (accum_1.v = 0.0; (int)accum_1.v < channels; accum_1.v = (float)((int)accum_1.v + 1)) {
          idx_1 = 0;
          math::Accum<float>::Accum((Accum<float> *)&i_2,(float *)&idx_1);
          for (local_c8 = -kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
              local_c8 <=
              kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_; local_c8 = local_c8 + 1) {
            local_d8[2] = cc_1 + local_c8;
            local_d8[1] = 0;
            local_d8[0] = height + -1;
            piVar5 = math::clamp<int>(local_d8 + 2,local_d8 + 1,local_d8);
            local_cc = *piVar5;
            peVar7 = std::
                     __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&y);
            pfVar6 = Image<float>::at(peVar7,local_cc * width + (int)accum_1.w,(int)accum_1.v);
            iVar2 = local_c8;
            if (local_c8 < 1) {
              iVar2 = -local_c8;
            }
            pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)&i,(long)iVar2);
            math::Accum<float>::add((Accum<float> *)&i_2,pfVar6,*pvVar4);
          }
          fVar9 = math::Accum<float>::normalized((Accum<float> *)&i_2);
          peVar7 = std::
                   __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          pfVar6 = Image<float>::at(peVar7,x,(int)accum_1.v);
          *pfVar6 = fVar9;
        }
        x = x + 1;
      }
    }
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)&y);
    std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i)
    ;
    _Var8._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)in);
    PVar11 = Image<float>::duplicate((Image<float> *)this);
    _Var8 = PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
blur_gaussian (typename Image<T>::ConstPtr in, float sigma)
{
    if (in == nullptr)
        throw std::invalid_argument("Null image given");

    /* Small sigmas result in literally no change. */
    if (MATH_EPSILON_EQ(sigma, 0.0f, 0.1f))
        return in->duplicate();

    int const w = in->width();
    int const h = in->height();
    int const c = in->channels();
    int const ks = std::ceil(sigma * 2.884f); // Cap kernel at 1/128
    std::vector<float> kernel(ks + 1);

    /* Fill kernel values. */
    for (int i = 0; i < ks + 1; ++i)
        kernel[i] = math::gaussian((float)i, sigma);

#if 1 // Separated kernel implementation

    /* Convolve the image in x direction. */
    typename Image<T>::Ptr sep(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < (int)c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(x + i, 0, (int)w - 1);
                    accum.add(in->at(y * w + idx, cc), kernel[std::abs(i)]);
                }
                sep->at(px, cc) = accum.normalized();
            }

    /* Convolve the image in y direction. */
    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(y + i, 0, (int)h - 1);
                    accum.add(sep->at(idx * w + x, cc), kernel[std::abs(i)]);
                }
                out->at(px, cc) = accum.normalized();
            }

#else // Non-separated kernel implementation

    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));

                for (int ky = -ks; ky <= ks; ++ky)
                    for (int kx = -ks; kx <= ks; ++kx)
                    {
                        int idx_x = math::clamp(x + kx, 0, (int)w - 1);
                        int idx_y = math::clamp(y + ky, 0, (int)h - 1);
                        accum.add(in->at(idx_y * w + idx_x, cc),
                            kernel[std::abs(kx)] * kernel[std::abs(ky)]);
                    }

                out->at(px, cc) = accum.normalized();
            }

#endif

    return out;
}